

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ANAplanner.cpp
# Opt level: O0

void __thiscall
anaPlanner::UpdateSuccs(anaPlanner *this,anaState *state,anaSearchStateSpace_t *pSearchStateSpace)

{
  AbstractSearchState *AbstractSearchState;
  size_type sVar1;
  reference pvVar2;
  uint *in_RDX;
  long in_RSI;
  long in_RDI;
  CKey *unaff_retaddr;
  AbstractSearchState *in_stack_00000008;
  CHeap *in_stack_00000010;
  int cost;
  CMDPSTATE *SuccMDPState;
  int sind;
  anaState *n;
  CKey key;
  vector<int,_std::allocator<int>_> CostV;
  vector<int,_std::allocator<int>_> SuccIDV;
  anaSearchStateSpace_t *in_stack_00000108;
  int in_stack_00000114;
  anaPlanner *in_stack_00000118;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  anaState *in_stack_ffffffffffffff38;
  anaSearchStateSpace_t *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  int iVar3;
  CKey local_a8;
  long local_98;
  undefined4 in_stack_ffffffffffffff78;
  value_type vVar4;
  anaSearchStateSpace_t *this_00;
  int local_74;
  CKey local_58;
  vector<int,_std::allocator<int>_> local_48;
  vector<int,_std::allocator<int>_> local_30;
  uint *local_18;
  long local_10;
  
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1984f9);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x198506);
  CKey::CKey(&local_58);
  (**(code **)(**(long **)(in_RDI + 8) + 0x28))
            (*(long **)(in_RDI + 8),**(undefined4 **)(local_10 + 0x18),&local_30,&local_48);
  local_74 = 0;
  while (iVar3 = local_74, sVar1 = std::vector<int,_std::allocator<int>_>::size(&local_30),
        iVar3 < (int)sVar1) {
    std::vector<int,_std::allocator<int>_>::operator[](&local_30,(long)local_74);
    in_stack_ffffffffffffff40 =
         (anaSearchStateSpace_t *)GetState(in_stack_00000118,in_stack_00000114,in_stack_00000108);
    this_00 = in_stack_ffffffffffffff40;
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_74);
    vVar4 = *pvVar2;
    AbstractSearchState =
         (AbstractSearchState *)
         (this_00->searchMDP).StateArray.
         super__Vector_base<CMDPSTATE_*,_std::allocator<CMDPSTATE_*>_>._M_impl.
         super__Vector_impl_data._M_start;
    if (*(short *)((long)&AbstractSearchState[1].heapindex + 2) != *(short *)((long)local_18 + 0x22)
       ) {
      ReInitializeSearchStateInfo
                ((anaPlanner *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,
                 (anaSearchStateSpace_t *)
                 CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    }
    if (((uint)(*(int *)(local_10 + 0x24) + vVar4) <
         *(uint *)((long)AbstractSearchState[1].listelem + 0xc)) &&
       (*(int *)(local_10 + 0x24) + vVar4 + AbstractSearchState[2].StateType < *local_18)) {
      *(int *)((long)AbstractSearchState[1].listelem + 0xc) = *(int *)(local_10 + 0x24) + vVar4;
      AbstractSearchState[2].listelem[0] = *(listelement **)(local_10 + 0x18);
      in_stack_ffffffffffffff38 =
           (anaState *)
           get_e_value((anaPlanner *)CONCAT44(iVar3,in_stack_ffffffffffffff48),
                       in_stack_ffffffffffffff40,(int)((ulong)in_stack_ffffffffffffff38 >> 0x20));
      local_58.key[0] = (long)-(double)in_stack_ffffffffffffff38;
      in_stack_ffffffffffffff37 = CHeap::inheap(*(CHeap **)(local_18 + 6),AbstractSearchState);
      if ((bool)in_stack_ffffffffffffff37) {
        local_98 = local_58.key[0];
        CHeap::updateheap((CHeap *)this_00,
                          (AbstractSearchState *)CONCAT44(vVar4,in_stack_ffffffffffffff78),
                          (CKey *)local_58.key[1]);
        CKey::~CKey((CKey *)&local_98);
      }
      else {
        local_a8.key[0] = local_58.key[0];
        local_a8.key[1] = local_58.key[1];
        CHeap::insertheap(in_stack_00000010,in_stack_00000008,unaff_retaddr);
        CKey::~CKey(&local_a8);
      }
    }
    local_74 = local_74 + 1;
  }
  CKey::~CKey(&local_58);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff40);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff40);
  return;
}

Assistant:

void anaPlanner::UpdateSuccs(anaState* state, anaSearchStateSpace_t* pSearchStateSpace)
{
    vector<int> SuccIDV;
    vector<int> CostV;
    CKey key;
    anaState *n;

    environment_->GetSuccs(state->MDPstate->StateID, &SuccIDV, &CostV);

    //iterate through predecessors of s
    for (int sind = 0; sind < (int)SuccIDV.size(); sind++) {
        CMDPSTATE* SuccMDPState = GetState(SuccIDV[sind], pSearchStateSpace);
        int cost = CostV[sind];

        n = (anaState*)(SuccMDPState->PlannerSpecificData);
        if (n->callnumberaccessed != pSearchStateSpace->callnumber) ReInitializeSearchStateInfo(n, pSearchStateSpace);

        //see if we can improve the value of n
        //taking into account the cost of action
        if ((n->g > state->g + cost) && ((state->g + cost + n->h) < pSearchStateSpace->G)) {
            n->g = state->g + cost;
            n->bestpredstate = state->MDPstate;

            key.key[0] = (long)-get_e_value(pSearchStateSpace, n->MDPstate->StateID);
            /*if(key.key[0] >= -1) {
             printf("inserting on Open with key =%d\n", key.key[0]);
             }*/
            if (pSearchStateSpace->heap->inheap(n)) {
                pSearchStateSpace->heap->updateheap(n, key);
            }
            else {
                pSearchStateSpace->heap->insertheap(n, key);
            }
        }
    }
}